

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

uint tcu::anon_unknown_75::convertSatRte<unsigned_int>(float f)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  undefined8 local_30;
  deInt64 intVal;
  float q;
  deInt64 maxVal;
  deInt64 minVal;
  float f_local;
  
  uVar1 = std::numeric_limits<unsigned_int>::min();
  uVar2 = std::numeric_limits<unsigned_int>::max();
  fVar4 = deFloatFrac(f);
  local_30 = (long)(f - fVar4);
  if ((fVar4 != 0.5) || (NAN(fVar4))) {
    if (0.5 < fVar4) {
      local_30 = local_30 + 1;
    }
  }
  else if (local_30 % 2 != 0) {
    local_30 = local_30 + 1;
  }
  lVar3 = de::min<long>((ulong)uVar2,local_30);
  lVar3 = de::max<long>((ulong)uVar1,lVar3);
  return (uint)lVar3;
}

Assistant:

inline T convertSatRte (float f)
{
	// \note Doesn't work for 64-bit types
	DE_STATIC_ASSERT(sizeof(T) < sizeof(deUint64));
	DE_STATIC_ASSERT((-3 % 2 != 0) && (-4 % 2 == 0));

	deInt64	minVal	= std::numeric_limits<T>::min();
	deInt64 maxVal	= std::numeric_limits<T>::max();
	float	q		= deFloatFrac(f);
	deInt64 intVal	= (deInt64)(f-q);

	// Rounding.
	if (q == 0.5f)
	{
		if (intVal % 2 != 0)
			intVal++;
	}
	else if (q > 0.5f)
		intVal++;
	// else Don't add anything

	// Saturate.
	intVal = de::max(minVal, de::min(maxVal, intVal));

	return (T)intVal;
}